

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_io.c
# Opt level: O0

void voutlet_dspepilog(_voutlet *x,t_signal **parentsigs,int myvecsize,int calcsize,int phase,
                      int period,int frequency,int downsample,int upsample,int reblock,int switched)

{
  int iVar1;
  t_sample *__s;
  uint local_74;
  t_signal *outsig_1;
  int method;
  t_sample *buf;
  int blockphase;
  int epilogphase;
  int bigperiod;
  int re_parentvecsize;
  int oldbufsize;
  int bufsize;
  int parentvecsize;
  t_signal *outsig;
  int period_local;
  int phase_local;
  int calcsize_local;
  int myvecsize_local;
  t_signal **parentsigs_local;
  _voutlet *x_local;
  
  if (x->x_buf != (t_sample *)0x0) {
    (x->x_updown).downsample = downsample;
    (x->x_updown).upsample = upsample;
    if (reblock == 0) {
      if ((switched != 0) && (parentsigs != (t_signal **)0x0)) {
        iVar1 = outlet_getsignalindex(x->x_parentoutlet);
        dsp_add_zero(parentsigs[iVar1]->s_vec,parentsigs[iVar1]->s_n);
      }
    }
    else {
      if (parentsigs == (t_signal **)0x0) {
        _bufsize = (t_signal *)0x0;
        oldbufsize = 1;
        epilogphase = 1;
      }
      else {
        iVar1 = outlet_getsignalindex(x->x_parentoutlet);
        _bufsize = parentsigs[iVar1];
        oldbufsize = _bufsize->s_vecsize;
        epilogphase = (oldbufsize * upsample) / downsample;
      }
      blockphase = myvecsize / epilogphase;
      if (blockphase == 0) {
        blockphase = 1;
      }
      re_parentvecsize = epilogphase;
      if (epilogphase < myvecsize) {
        re_parentvecsize = myvecsize;
      }
      if (re_parentvecsize != x->x_bufsize) {
        freebytes(x->x_buf,(long)x->x_bufsize << 2);
        __s = (t_sample *)getbytes((long)re_parentvecsize << 2);
        memset(__s,0,(long)re_parentvecsize << 2);
        x->x_bufsize = re_parentvecsize;
        x->x_endbuf = __s + re_parentvecsize;
        x->x_buf = __s;
      }
      if (re_parentvecsize < epilogphase * period) {
        bug("voutlet_dspepilog");
      }
      x->x_write = x->x_buf +
                   (int)(epilogphase * ((phase + period) - 1U & blockphase - 1U & -period));
      if (x->x_write == x->x_endbuf) {
        x->x_write = x->x_buf;
      }
      if ((period == 1) && (1 < frequency)) {
        x->x_hop = epilogphase / frequency;
      }
      else {
        x->x_hop = period * epilogphase;
      }
      if (parentsigs != (t_signal **)0x0) {
        x->x_empty = x->x_buf + (int)(epilogphase * (phase & blockphase - 1U));
        if (upsample * downsample == 1) {
          dsp_add(voutlet_doepilog,3,x,_bufsize->s_vec,(long)epilogphase);
        }
        else {
          if ((x->x_updown).method < 0) {
            local_74 = (uint)(0x2b < pd_compatibilitylevel);
          }
          else {
            local_74 = (x->x_updown).method;
          }
          dsp_add(voutlet_doepilog_resampling,2,x,(long)epilogphase);
          resampleto_dsp(&x->x_updown,_bufsize->s_vec,epilogphase,oldbufsize,local_74);
        }
      }
    }
  }
  return;
}

Assistant:

void voutlet_dspepilog(struct _voutlet *x, t_signal **parentsigs,
    int myvecsize, int calcsize, int phase, int period, int frequency,
    int downsample, int upsample, int reblock, int switched)
{
    if (!x->x_buf) return;  /* this shouldn't be necesssary... */
    x->x_updown.downsample=downsample;
    x->x_updown.upsample=upsample;
    if (reblock)
    {
        t_signal *outsig;
        int parentvecsize, bufsize, oldbufsize;
        int re_parentvecsize;
        int bigperiod, epilogphase, blockphase;
        if (parentsigs)
        {
            outsig = parentsigs[outlet_getsignalindex(x->x_parentoutlet)];
            parentvecsize = outsig->s_vecsize;
            re_parentvecsize = parentvecsize * upsample / downsample;
        }
        else
        {
            outsig = 0;
            parentvecsize = 1;
            re_parentvecsize = 1;
        }
        bigperiod = myvecsize/re_parentvecsize;
        if (!bigperiod) bigperiod = 1;
        epilogphase = phase & (bigperiod - 1);
        blockphase = (phase + period - 1) & (bigperiod - 1) & (- period);
        bufsize = re_parentvecsize;
        if (bufsize < myvecsize) bufsize = myvecsize;
        if (bufsize != (oldbufsize = x->x_bufsize))
        {
            t_sample *buf = x->x_buf;
            t_freebytes(buf, oldbufsize * sizeof(*buf));
            buf = (t_sample *)t_getbytes(bufsize * sizeof(*buf));
            memset((char *)buf, 0, bufsize * sizeof(*buf));
            x->x_bufsize = bufsize;
            x->x_endbuf = buf + bufsize;
            x->x_buf = buf;
        }
        if (re_parentvecsize * period > bufsize) bug("voutlet_dspepilog");
        x->x_write = x->x_buf + re_parentvecsize * blockphase;
        if (x->x_write == x->x_endbuf) x->x_write = x->x_buf;
        if (period == 1 && frequency > 1)
            x->x_hop = re_parentvecsize / frequency;
        else x->x_hop = period * re_parentvecsize;
        /* post("phase %d, block %d, parent %d", phase & 63,
            parentvecsize * blockphase, parentvecsize * epilogphase); */
        if (parentsigs)
        {
            /* set epilog pointer and schedule it */
            x->x_empty = x->x_buf + re_parentvecsize * epilogphase;
            if (upsample * downsample == 1)
                dsp_add(voutlet_doepilog, 3, x, outsig->s_vec,
                    (t_int)re_parentvecsize);
            else
            {
                int method = (x->x_updown.method < 0 ?
                    (pd_compatibilitylevel < 44 ? 0 : 1) : x->x_updown.method);
                dsp_add(voutlet_doepilog_resampling, 2, x, (t_int)re_parentvecsize);
                resampleto_dsp(&x->x_updown, outsig->s_vec, re_parentvecsize,
                    parentvecsize, method);
            }
        }
    }
        /* if we aren't blocked but we are switched, the epilog code just
        copies zeros to the output.  In this case the blocking code actually
        jumps over the epilog if the block is running. */
    else if (switched)
    {
        if (parentsigs)
        {
            t_signal *outsig =
                parentsigs[outlet_getsignalindex(x->x_parentoutlet)];
            dsp_add_zero(outsig->s_vec, outsig->s_n);
        }
    }
}